

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBench.c
# Opt level: O2

int Io_WriteBenchCheckNames(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  byte *pbVar2;
  int i;
  
  i = 0;
  do {
    if (pNtk->vObjs->nSize <= i) {
      return 1;
    }
    pAVar1 = Abc_NtkObj(pNtk,i);
    if (pAVar1 != (Abc_Obj_t *)0x0) {
      for (pbVar2 = (byte *)Nm_ManFindNameById(pNtk->pManName,i); pbVar2 != (byte *)0x0;
          pbVar2 = pbVar2 + 1) {
        if (*pbVar2 - 0x28 < 2) {
          return 0;
        }
        if (*pbVar2 == 0) break;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Io_WriteBenchCheckNames( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    char * pName;
    int i;
    Abc_NtkForEachObj( pNtk, pObj, i )
        for ( pName = Nm_ManFindNameById(pNtk->pManName, i); pName && *pName; pName++ )
            if ( *pName == '(' || *pName == ')' )
                return 0;
    return 1;
}